

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct16x16_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  longlong lVar2;
  longlong lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  undefined1 auVar9 [16];
  uint uVar14;
  undefined1 auVar15 [16];
  int iVar16;
  
  iVar6 = 1 << ((char)bit - 1U & 0x1f);
  iVar7 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar5 = 0x8000;
  if (0xf < iVar7) {
    iVar5 = 1 << ((char)iVar7 - 1U & 0x1f);
  }
  auVar15 = ZEXT416((uint)bit);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + (long)bit * 0x100 + 0x1e0);
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  auVar9 = pmulld(auVar9,(undefined1  [16])*in);
  iVar7 = auVar9._0_4_ + iVar6 >> auVar15;
  iVar10 = auVar9._4_4_ + iVar6 >> auVar15;
  iVar12 = auVar9._8_4_ + iVar6 >> auVar15;
  iVar6 = auVar9._12_4_ + iVar6 >> auVar15;
  if (do_cols == 0) {
    iVar5 = 10;
    if (10 < bd) {
      iVar5 = bd;
    }
    iVar5 = 0x20 << ((byte)iVar5 & 0x1f);
    iVar4 = -iVar5;
    iVar5 = iVar5 + -1;
    if (out_shift != 0) {
      iVar16 = (1 << ((byte)out_shift & 0x1f)) >> 1;
      auVar9 = ZEXT416((uint)out_shift);
      iVar7 = iVar7 + iVar16 >> auVar9;
      iVar10 = iVar10 + iVar16 >> auVar9;
      iVar12 = iVar12 + iVar16 >> auVar9;
      iVar6 = iVar6 + iVar16 >> auVar9;
    }
  }
  else {
    iVar4 = -iVar5;
    iVar5 = iVar5 + -1;
  }
  uVar8 = (uint)(iVar7 < iVar4) * iVar4 | (uint)(iVar7 >= iVar4) * iVar7;
  uVar11 = (uint)(iVar10 < iVar4) * iVar4 | (uint)(iVar10 >= iVar4) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  uVar14 = (uint)(iVar6 < iVar4) * iVar4 | (uint)(iVar6 >= iVar4) * iVar6;
  uVar8 = (uint)(iVar5 < (int)uVar8) * iVar5 | (iVar5 >= (int)uVar8) * uVar8;
  uVar11 = (uint)(iVar5 < (int)uVar11) * iVar5 | (iVar5 >= (int)uVar11) * uVar11;
  uVar13 = (uint)(iVar5 < (int)uVar13) * iVar5 | (iVar5 >= (int)uVar13) * uVar13;
  uVar14 = (uint)(iVar5 < (int)uVar14) * iVar5 | (iVar5 >= (int)uVar14) * uVar14;
  *(uint *)*in = uVar8;
  *(uint *)((long)*in + 4) = uVar11;
  *(uint *)(*in + 1) = uVar13;
  *(uint *)((long)*in + 0xc) = uVar14;
  *(uint *)*out = uVar8;
  *(uint *)((long)*out + 4) = uVar11;
  *(uint *)(*out + 1) = uVar13;
  *(uint *)((long)*out + 0xc) = uVar14;
  lVar2 = (*in)[0];
  lVar3 = (*in)[1];
  out[1][0] = lVar2;
  out[1][1] = lVar3;
  out[2][0] = lVar2;
  out[2][1] = lVar3;
  lVar2 = (*in)[0];
  lVar3 = (*in)[1];
  out[3][0] = lVar2;
  out[3][1] = lVar3;
  out[4][0] = lVar2;
  out[4][1] = lVar3;
  lVar2 = (*in)[0];
  lVar3 = (*in)[1];
  out[5][0] = lVar2;
  out[5][1] = lVar3;
  out[6][0] = lVar2;
  out[6][1] = lVar3;
  lVar2 = (*in)[0];
  lVar3 = (*in)[1];
  out[7][0] = lVar2;
  out[7][1] = lVar3;
  out[8][0] = lVar2;
  out[8][1] = lVar3;
  lVar2 = (*in)[0];
  lVar3 = (*in)[1];
  out[9][0] = lVar2;
  out[9][1] = lVar3;
  out[10][0] = lVar2;
  out[10][1] = lVar3;
  lVar2 = (*in)[0];
  lVar3 = (*in)[1];
  out[0xb][0] = lVar2;
  out[0xb][1] = lVar3;
  out[0xc][0] = lVar2;
  out[0xc][1] = lVar3;
  lVar2 = (*in)[0];
  lVar3 = (*in)[1];
  out[0xd][0] = lVar2;
  out[0xd][1] = lVar3;
  out[0xe][0] = lVar2;
  out[0xe][1] = lVar3;
  lVar2 = (*in)[1];
  out[0xf][0] = (*in)[0];
  out[0xf][1] = lVar2;
  return;
}

Assistant:

static void idct16x16_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  // stage 0
  // stage 1
  // stage 2
  // stage 3
  // stage 4
  in[0] = _mm_mullo_epi32(in[0], cospi32);
  in[0] = _mm_add_epi32(in[0], rnding);
  in[0] = _mm_srai_epi32(in[0], bit);

  // stage 5
  // stage 6
  // stage 7
  if (!do_cols) {
    log_range = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    if (out_shift != 0) {
      __m128i offset = _mm_set1_epi32((1 << out_shift) >> 1);
      in[0] = _mm_add_epi32(in[0], offset);
      in[0] = _mm_sra_epi32(in[0], _mm_cvtsi32_si128(out_shift));
    }
  }

  in[0] = _mm_max_epi32(in[0], clamp_lo);
  in[0] = _mm_min_epi32(in[0], clamp_hi);
  out[0] = in[0];
  out[1] = in[0];
  out[2] = in[0];
  out[3] = in[0];
  out[4] = in[0];
  out[5] = in[0];
  out[6] = in[0];
  out[7] = in[0];
  out[8] = in[0];
  out[9] = in[0];
  out[10] = in[0];
  out[11] = in[0];
  out[12] = in[0];
  out[13] = in[0];
  out[14] = in[0];
  out[15] = in[0];
}